

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ObjectivePropagation::updateActivityLbChange
          (ObjectivePropagation *this,HighsInt col,double oldbound,double newbound)

{
  HighsCDouble *this_00;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *pvVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  HighsDomain *pHVar5;
  HighsMipSolver *pHVar6;
  pointer pOVar7;
  pointer ppVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_48;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_38;
  
  this_00 = &this->objectiveLower;
  while( true ) {
    dVar12 = oldbound;
    dVar11 = this->cost[col];
    if (dVar11 <= 0.0) {
      if ((newbound < dVar12) && ((dVar11 != 0.0 || (NAN(dVar11))))) {
        pHVar6 = this->domain->mipsolver;
        dVar12 = ((pHVar6->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        dVar14 = (this->domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[col] - newbound;
        if ((pHVar6->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[col] == kContinuous) {
          dVar13 = dVar14 * 0.3;
          dVar12 = dVar12 * 1000.0;
          if (dVar12 <= dVar13) {
            dVar12 = dVar13;
          }
        }
        dVar11 = (dVar14 - dVar12) * -dVar11;
        if (dVar11 <= this->capacityThreshold) {
          dVar11 = this->capacityThreshold;
        }
        this->capacityThreshold = dVar11;
        this->isPropagated = false;
      }
      return;
    }
    this->isPropagated = false;
    uVar3 = (this->objFunc->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    lVar10 = (long)(int)uVar3;
    if (lVar10 != -1) break;
    if (-INFINITY < dVar12) {
      HighsCDouble::operator-=(this_00,dVar11 * dVar12);
    }
    else {
      this->numInfObjLower = this->numInfObjLower + -1;
    }
    if (-INFINITY < newbound) {
      HighsCDouble::operator+=(this_00,this->cost[col] * newbound);
    }
    else {
      this->numInfObjLower = this->numInfObjLower + 1;
    }
    if (newbound < dVar12) {
      pHVar5 = this->domain;
      dVar11 = ((pHVar5->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      dVar12 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col] -
               (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col];
      if ((pHVar5->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[col] == kContinuous) {
        dVar14 = dVar12 * 0.3;
        dVar11 = dVar11 * 1000.0;
        if (dVar11 <= dVar14) {
          dVar11 = dVar14;
        }
      }
      dVar11 = this->cost[col] * (dVar12 - dVar11);
      if (dVar11 <= this->capacityThreshold) {
        dVar11 = this->capacityThreshold;
      }
      this->capacityThreshold = dVar11;
      return;
    }
    if (this->numInfObjLower != 0) {
      return;
    }
    pHVar5 = this->domain;
    dVar11 = (this->objectiveLower).hi + (this->objectiveLower).lo;
    pdVar2 = &((pHVar5->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if (dVar11 < *pdVar2 || dVar11 == *pdVar2) {
      return;
    }
    pHVar5->infeasible_ = true;
    pHVar5->infeasible_pos =
         (HighsInt)
         ((ulong)((long)(pHVar5->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar5->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4);
    (pHVar5->infeasible_reason).type = -7;
    (pHVar5->infeasible_reason).index = 0;
    oldbound = newbound;
    newbound = dVar12;
  }
  pvVar1 = &this->objectiveLowerContributions;
  pOVar7 = (this->objectiveLowerContributions).
           super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = pvVar1;
  if ((newbound != 0.0) || (NAN(newbound))) {
    ppVar8 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.rootNode =
         &ppVar8[pOVar7[lVar10].partition].first;
    local_48.first_ = &ppVar8[pOVar7[lVar10].partition].second;
    if (*local_48.first_ == uVar3) {
      HighsCDouble::operator+=(this_00,pOVar7[lVar10].contribution);
      ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
                (&local_48,(char *)(ulong)uVar3);
      if ((long)*local_48.first_ != -1) {
        HighsCDouble::operator-=
                  (this_00,(pvVar1->
                           super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                           )._M_impl.super__Vector_impl_data._M_start[*local_48.first_].contribution
                  );
      }
    }
    else {
      ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
                (&local_48,(char *)(ulong)uVar3);
    }
    if (this->numInfObjLower != 0) {
      return;
    }
    pHVar5 = this->domain;
    dVar11 = (this->objectiveLower).hi + (this->objectiveLower).lo;
    pdVar2 = &((pHVar5->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if (dVar11 < *pdVar2 || dVar11 == *pdVar2) {
      return;
    }
    pHVar5->infeasible_ = true;
    pHVar5->infeasible_pos =
         (HighsInt)
         ((ulong)((long)(pHVar5->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar5->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4);
    (pHVar5->infeasible_reason).type = -7;
    (pHVar5->infeasible_reason).index = 0;
    updateActivityLbChange(this,col,newbound,dVar12);
    return;
  }
  ppVar8 = (this->contributionPartitionSets).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.rootNode =
       &ppVar8[pOVar7[lVar10].partition].first;
  local_48.first_ = &ppVar8[pOVar7[lVar10].partition].second;
  iVar4 = *local_48.first_;
  ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
            (&local_48.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
             (char *)(ulong)uVar3,
             (char *)local_48.
                     super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
                     rootNode);
  dVar11 = 0.0;
  pOVar7 = (this->objectiveLowerContributions).
           super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)iVar4 != -1) {
    dVar11 = pOVar7[iVar4].contribution;
  }
  dVar12 = pOVar7[lVar10].contribution;
  if (uVar3 == *local_48.first_) {
    if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
      HighsCDouble::operator+=(this_00,dVar11);
      HighsCDouble::operator-=
                (this_00,(pvVar1->
                         super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar10].contribution);
      uVar9 = ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::last
                        (&local_48.
                          super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>
                        );
      pOVar7 = (pvVar1->
               super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar11 = pOVar7[lVar10].contribution;
      if (uVar9 != uVar3) {
        dVar11 = dVar11 - pOVar7[(int)uVar9].contribution;
      }
      goto LAB_002a0e70;
    }
  }
  dVar11 = dVar11 - dVar12;
LAB_002a0e70:
  dVar11 = (1.0 - ((this->domain->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol) *
           dVar11;
  dVar12 = this->capacityThreshold;
  if (this->capacityThreshold <= dVar11) {
    dVar12 = dVar11;
  }
  this->capacityThreshold = dVar12;
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::updateActivityLbChange(
    HighsInt col, double oldbound, double newbound) {
  if (cost[col] <= 0.0) {
    if (cost[col] != 0.0 && newbound < oldbound) {
      capacityThreshold =
          std::max(capacityThreshold,
                   -cost[col] * boundRange(domain->col_upper_[col], newbound,
                                           domain->feastol(),
                                           domain->variableType(col)));
      isPropagated = false;
    }
    debugCheckObjectiveLower();
    return;
  }

  isPropagated = false;

  HighsInt partitionPos = objFunc->getColCliquePartition(col);
  if (partitionPos == -1) {
    if (oldbound == -kHighsInf)
      --numInfObjLower;
    else
      objectiveLower -= oldbound * cost[col];

    if (newbound == -kHighsInf)
      ++numInfObjLower;
    else
      objectiveLower += newbound * cost[col];

    debugCheckObjectiveLower();

    if (newbound < oldbound) {
      capacityThreshold = std::max(
          capacityThreshold,
          cost[col] * boundRange(domain->col_upper_[col],
                                 domain->col_lower_[col], domain->feastol(),
                                 domain->variableType(col)));
    } else if (numInfObjLower == 0 &&
               objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
      domain->infeasible_ = true;
      domain->infeasible_pos = domain->domchgstack_.size();
      domain->infeasible_reason = Reason::objective();
      updateActivityLbChange(col, newbound, oldbound);
    }
  } else {
    if (newbound == 0.0) {
      assert(oldbound == 1.0);
      // binary lower bound of variable in clique partition is relaxed to 0
      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      HighsInt currFirst = contributionTree.first();

      contributionTree.link(partitionPos);

      double oldContribution = 0.0;
      if (currFirst != -1)
        oldContribution = objectiveLowerContributions[currFirst].contribution;

      if (partitionPos == contributionTree.first() &&
          objectiveLowerContributions[partitionPos].contribution !=
              oldContribution) {
        objectiveLower += oldContribution;
        objectiveLower -=
            objectiveLowerContributions[partitionPos].contribution;

        // update the capacity threshold with the difference of the new highest
        // contribution position to the lowest contribution as the column with
        // the lowest contribution can be fixed to its bound that yields the
        // highest objective value.
        HighsInt bestPos = contributionTree.last();
        double delta = objectiveLowerContributions[partitionPos].contribution;
        if (bestPos != partitionPos)
          delta -= objectiveLowerContributions[bestPos].contribution;
        capacityThreshold =
            std::max(delta * (1.0 - domain->feastol()), capacityThreshold);
      } else {
        // the new linked column could be the one with the new lowest
        // contribution so update the capacity threshold to ensure propagation
        // runs when it can be fixed to the bound that yields the highest
        // objective value
        capacityThreshold =
            std::max((oldContribution -
                      objectiveLowerContributions[partitionPos].contribution) *
                         (1.0 - domain->feastol()),
                     capacityThreshold);
      }

      debugCheckObjectiveLower();
    } else {
      // binary lower bound of variable in clique partition is tightened to 1
      assert(oldbound == 0.0);
      assert(newbound == 1.0);

      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      bool wasFirst = contributionTree.first() == partitionPos;
      if (wasFirst)
        objectiveLower +=
            objectiveLowerContributions[partitionPos].contribution;

      contributionTree.unlink(partitionPos);

      if (wasFirst) {
        HighsInt newWorst = contributionTree.first();
        if (newWorst != -1)
          objectiveLower -= objectiveLowerContributions[newWorst].contribution;
      }

      debugCheckObjectiveLower();

      if (numInfObjLower == 0 &&
          objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
        domain->infeasible_ = true;
        domain->infeasible_pos = domain->domchgstack_.size();
        domain->infeasible_reason = Reason::objective();
        updateActivityLbChange(col, newbound, oldbound);
      }
    }
  }
}